

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectlight.cpp
# Opt level: O0

double __thiscall RectLight::getShadowRatio(RectLight *this,Scene *scene,Vector3 *p)

{
  bool bVar1;
  reference ppOVar2;
  undefined1 local_150 [8];
  Collision coll;
  __normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_> local_c8;
  const_iterator o;
  double dist;
  Vector3 dir;
  Vector3 local_88;
  Vector3 local_70;
  undefined1 local_58 [8];
  Vector3 c;
  double y;
  double x;
  int local_28;
  int j;
  int i;
  int ret;
  Vector3 *p_local;
  Scene *scene_local;
  RectLight *this_local;
  
  j = 0x10;
  local_28 = 0;
  do {
    if (3 < local_28) {
      return (((double)j * 1.0) / 4.0) / 4.0;
    }
    for (x._4_4_ = 0; x._4_4_ < 4; x._4_4_ = x._4_4_ + 1) {
      c.z = (((double)x._4_4_ + 0.5) * 2.0) / 4.0 - 1.0;
      Vector3::operator*(&local_88,&this->m_dx,(((double)local_28 + 0.5) * 2.0) / 4.0 - 1.0);
      operator+(&local_70,&this->m_o,&local_88);
      Vector3::operator*((Vector3 *)&dir.z,&this->m_dy,c.z);
      operator+((Vector3 *)local_58,&local_70,(Vector3 *)&dir.z);
      operator-((Vector3 *)&dist,(Vector3 *)local_58,p);
      o._M_current = (Object **)Vector3::mod((Vector3 *)&dist);
      local_c8._M_current = (Object **)Scene::objectsBegin(scene);
      while( true ) {
        coll.is_internal = (double)Scene::objectsEnd(scene);
        bVar1 = __gnu_cxx::operator!=
                          (&local_c8,
                           (__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                            *)&coll.is_internal);
        if (!bVar1) break;
        ppOVar2 = __gnu_cxx::
                  __normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                  ::operator*(&local_c8);
        (*(*ppOVar2)->_vptr_Object[2])(local_150,*ppOVar2,p,&dist);
        bVar1 = Collision::isHit((Collision *)local_150);
        if ((bVar1) && (coll.n.z + 1e-06 < (double)o._M_current)) {
          j = j + -1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>::
        operator++(&local_c8,0);
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

double RectLight::getShadowRatio(const Scene* scene, const Vector3& p) const
{
    int ret = SHADOW_SAMPLE * SHADOW_SAMPLE;
    for (int i = 0; i < SHADOW_SAMPLE; i++)
        for (int j = 0; j < SHADOW_SAMPLE; j++)
        {
            double x = (i + 0.5) * 2 / SHADOW_SAMPLE - 1,
                   y = (j + 0.5) * 2 / SHADOW_SAMPLE - 1;
            Vector3 c = m_o + m_dx * x + m_dy * y, dir = c - p;
            double dist = dir.mod();

            for (auto o = scene->objectsBegin(); o != scene->objectsEnd(); o++)
            {
                Collision coll = (*o)->collide(p, dir);
                if (coll.isHit() && coll.dist + Const::EPS < dist)
                {
                    ret--;
                    break;
                }
            }
        }
    return 1.0 * ret / SHADOW_SAMPLE / SHADOW_SAMPLE;
}